

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void __thiscall MidiInApi::MidiInApi(MidiInApi *this,uint queueSizeLimit)

{
  ulong *puVar1;
  MidiMessage *pMVar2;
  ulong uVar3;
  MidiMessage *local_60;
  uint queueSizeLimit_local;
  MidiInApi *this_local;
  
  MidiApi::MidiApi(&this->super_MidiApi);
  (this->super_MidiApi)._vptr_MidiApi = (_func_int **)&PTR__MidiInApi_00126ae0;
  RtMidiInData::RtMidiInData(&this->inputData_);
  (this->inputData_).queue.ringSize = queueSizeLimit;
  if ((this->inputData_).queue.ringSize != 0) {
    uVar3 = (ulong)(this->inputData_).queue.ringSize;
    puVar1 = (ulong *)operator_new__(uVar3 << 5 | 8);
    *puVar1 = uVar3;
    pMVar2 = (MidiMessage *)(puVar1 + 1);
    if (uVar3 != 0) {
      local_60 = pMVar2;
      do {
        MidiMessage::MidiMessage(local_60);
        local_60 = local_60 + 1;
      } while (local_60 != pMVar2 + uVar3);
    }
    (this->inputData_).queue.ring = pMVar2;
  }
  return;
}

Assistant:

MidiInApi :: MidiInApi( unsigned int queueSizeLimit )
  : MidiApi()
{
  // Allocate the MIDI queue.
  inputData_.queue.ringSize = queueSizeLimit;
  if ( inputData_.queue.ringSize > 0 )
    inputData_.queue.ring = new MidiMessage[ inputData_.queue.ringSize ];
}